

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Geometry * rw::Geometry::create(int32 numVerts,int32 numTris,uint32 flags)

{
  int iVar1;
  FILE *__stream;
  uint uVar2;
  Geometry *this;
  Triangle *pTVar3;
  char *pcVar4;
  long lVar5;
  TexCoords *pTVar6;
  ulong uVar7;
  ulong uVar8;
  Error _e;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 30"
  ;
  this = (Geometry *)(*Engine::memfuncs)((long)(int)s_plglist,0x3000f);
  if (this == (Geometry *)0x0) {
    _e.plugin = 0xf;
    _e.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp"
            ,0x20);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar4);
    setError(&_e);
    return (Geometry *)0x0;
  }
  numAllocated = numAllocated + 1;
  (this->object).type = '\b';
  (this->object).subType = '\0';
  (this->object).flags = '\0';
  (this->object).privateFlags = '\0';
  (this->object).parent = (void *)0x0;
  this->flags = flags & 0xff00ffff;
  uVar2 = flags >> 0x10 & 0xff;
  if (uVar2 == 0) {
    uVar2 = flags >> 6 & 2;
    if ((flags & 4) != 0) {
      uVar2 = 1;
    }
  }
  this->numTexCoordSets = uVar2;
  this->numTriangles = numTris;
  this->numVertices = numVerts;
  this->colors = (RGBA *)0x0;
  for (lVar5 = 7; lVar5 != 0xf; lVar5 = lVar5 + 1) {
    this->texCoords[lVar5 + -7] = (TexCoords *)0x0;
  }
  this->triangles = (Triangle *)0x0;
  if ((flags >> 0x18 & 1) != 0) goto LAB_00107290;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 58"
  ;
  pTVar3 = (Triangle *)
           (*DAT_00145dd8)((long)(int)((numVerts * 4 & (int)(flags << 0x1c) >> 0x1f) +
                                      (uVar2 * numVerts + numTris) * 8),0x3000f);
  this->triangles = pTVar3;
  uVar2 = this->numTriangles;
  pTVar6 = (TexCoords *)(pTVar3 + (int)uVar2);
  iVar1 = this->numVertices;
  if ((this->flags & 8) == 0) {
    if (iVar1 != 0) {
LAB_00107252:
      uVar8 = 0;
      uVar7 = (ulong)(uint)this->numTexCoordSets;
      if (this->numTexCoordSets < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        this->texCoords[uVar8] = pTVar6;
        pTVar6 = pTVar6 + iVar1;
      }
    }
  }
  else if (iVar1 != 0) {
    this->colors = (RGBA *)pTVar6;
    pTVar6 = (TexCoords *)(&pTVar6->u + iVar1);
    goto LAB_00107252;
  }
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pTVar3[uVar7].matId = 0xffff;
  }
LAB_00107290:
  this->numMorphTargets = 0;
  this->morphTargets = (MorphTarget *)0x0;
  addMorphTargets(this,1);
  this->lockedSinceInst = 0;
  (this->matList).materials = (Material **)0x0;
  (this->matList).numMaterials = 0;
  (this->matList).space = 0;
  this->meshHeader = (MeshHeader *)0x0;
  this->instData = (InstanceDataHeader *)0x0;
  this->refCount = 1;
  PluginList::construct((PluginList *)&s_plglist,this);
  return this;
}

Assistant:

Geometry*
Geometry::create(int32 numVerts, int32 numTris, uint32 flags)
{
	Geometry *geo = (Geometry*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_GEOMETRY);
	if(geo == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	geo->object.init(Geometry::ID, 0);
	geo->flags = flags & 0xFF00FFFF;
	geo->numTexCoordSets = (flags & 0xFF0000) >> 16;
	if(geo->numTexCoordSets == 0)
		geo->numTexCoordSets = (geo->flags & TEXTURED)  ? 1 :
		                       (geo->flags & TEXTURED2) ? 2 : 0;
	geo->numTriangles = numTris;
	geo->numVertices = numVerts;

	geo->colors = nil;
	for(int32 i = 0; i < 8; i++)
		geo->texCoords[i] = nil;
	geo->triangles = nil;
	// Allocate all attributes at once. The triangle pointer
	// will hold the first address (even when there are no triangles)
	// so we can free easily.
	if(!(geo->flags & NATIVE)){
		int32 sz = geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT)
			sz += geo->numVertices*sizeof(RGBA);
		sz += geo->numTexCoordSets*geo->numVertices*sizeof(TexCoords);

		uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		geo->triangles = (Triangle*)data;
		data += geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT && geo->numVertices){
			geo->colors = (RGBA*)data;
			data += geo->numVertices*sizeof(RGBA);
		}
		if(geo->numVertices)
			for(int32 i = 0; i < geo->numTexCoordSets; i++){
				geo->texCoords[i] = (TexCoords*)data;
				data += geo->numVertices*sizeof(TexCoords);
			}

		// init triangles
		for(int32 i = 0; i < geo->numTriangles; i++)
			geo->triangles[i].matId = 0xFFFF;
	}
	geo->numMorphTargets = 0;
	geo->morphTargets = nil;
	geo->addMorphTargets(1);

	geo->matList.init();
	geo->lockedSinceInst = 0;
	geo->meshHeader = nil;
	geo->instData = nil;
	geo->refCount = 1;

	s_plglist.construct(geo);
	return geo;
}